

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O2

void __thiscall
cmMakefileTargetGenerator::AppendLinkDepends
          (cmMakefileTargetGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *depends)

{
  cmSourceFile *this_00;
  cmGeneratorTarget *this_01;
  string *psVar1;
  char *pcVar2;
  pointer ppcVar3;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> manifest_srcs;
  allocator local_59;
  string local_58;
  _Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_38;
  
  AppendObjectDepends(this,depends);
  AppendTargetDepends(this,depends);
  this_00 = (this->super_cmCommonTargetGenerator).ModuleDefinitionFile;
  if (this_00 != (cmSourceFile *)0x0) {
    psVar1 = cmSourceFile::GetFullPath_abi_cxx11_(this_00);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(depends,psVar1);
  }
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cmGeneratorTarget::GetManifests
            ((this->super_cmCommonTargetGenerator).GeneratorTarget,
             (vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *)&local_38,
             &(this->super_cmCommonTargetGenerator).ConfigName);
  for (ppcVar3 = local_38._M_impl.super__Vector_impl_data._M_start;
      ppcVar3 != local_38._M_impl.super__Vector_impl_data._M_finish; ppcVar3 = ppcVar3 + 1) {
    psVar1 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar3);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(depends,psVar1);
  }
  this_01 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string((string *)&local_58,"LINK_DEPENDS",&local_59);
  pcVar2 = cmGeneratorTarget::GetProperty(this_01,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (pcVar2 != (char *)0x0) {
    std::__cxx11::string::string((string *)&local_58,pcVar2,&local_59);
    cmSystemTools::ExpandListArgument(&local_58,depends,false);
    std::__cxx11::string::~string((string *)&local_58);
  }
  std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::~_Vector_base
            (&local_38);
  return;
}

Assistant:

void cmMakefileTargetGenerator
::AppendLinkDepends(std::vector<std::string>& depends)
{
  this->AppendObjectDepends(depends);

  // Add dependencies on targets that must be built first.
  this->AppendTargetDepends(depends);

  // Add a dependency on the link definitions file, if any.
  if(this->ModuleDefinitionFile)
    {
    depends.push_back(this->ModuleDefinitionFile->GetFullPath());
    }

  // Add a dependency on user-specified manifest files, if any.
  std::vector<cmSourceFile const*> manifest_srcs;
  this->GeneratorTarget->GetManifests(manifest_srcs, this->ConfigName);
  for (std::vector<cmSourceFile const*>::iterator mi = manifest_srcs.begin();
       mi != manifest_srcs.end(); ++mi)
    {
    depends.push_back((*mi)->GetFullPath());
    }

  // Add user-specified dependencies.
  if(const char* linkDepends =
     this->GeneratorTarget->GetProperty("LINK_DEPENDS"))
    {
    cmSystemTools::ExpandListArgument(linkDepends, depends);
    }
}